

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e ktxTexture2_SetTransferFunction(ktxTexture2 *This,khr_df_transfer_e tf)

{
  _Bool _Var1;
  ktx_error_code_e kVar2;
  
  _Var1 = isSrgbFormat(This->vkFormat);
  kVar2 = KTX_INVALID_OPERATION;
  if ((tf == KHR_DF_TRANSFER_SCRGB) || (!_Var1)) {
    _Var1 = isNotSrgbFormatButHasSrgbVariant(This->vkFormat);
    if ((tf != KHR_DF_TRANSFER_SCRGB) || (!_Var1)) {
      *(char *)((long)This->pDfd + 0xe) = (char)tf;
      kVar2 = KTX_SUCCESS;
    }
  }
  return kVar2;
}

Assistant:

ktx_error_code_e
ktxTexture2_SetTransferFunction(ktxTexture2* This, khr_df_transfer_e tf)
{
    if (isSrgbFormat(This->vkFormat) && tf != KHR_DF_TRANSFER_SRGB)
        return KTX_INVALID_OPERATION;

    if (isNotSrgbFormatButHasSrgbVariant(This->vkFormat) && tf == KHR_DF_TRANSFER_SRGB)
        return KTX_INVALID_OPERATION;

    KHR_DFDSETVAL(This->pDfd + 1, TRANSFER, tf);
    return KTX_SUCCESS;
}